

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::Unequip(Character *this,short item,uchar subloc)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  bool bVar2;
  bool bVar3;
  
  if (item == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    uVar1 = 0;
    do {
      if ((this->paperdoll)._M_elems[uVar1] == (int)CONCAT62(in_register_00000032,item)) {
        bVar3 = true;
        if ((uVar1 != 10) && (uVar1 != 0xc)) {
          bVar3 = uVar1 == 0xe;
        }
        if (bVar3 == (bool)subloc) {
          (this->paperdoll)._M_elems[uVar1] = 0;
          AddItem(this,item,1);
          CalculateStats(this,true);
          return bVar2;
        }
      }
      bVar2 = uVar1 < 0xe;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0xf);
  }
  return bVar2;
}

Assistant:

bool Character::Unequip(short item, unsigned char subloc)
{
	if (item == 0)
	{
		return false;
	}

	for (std::size_t i = 0; i < this->paperdoll.size(); ++i)
	{
		if (this->paperdoll[i] == item)
		{
			if (((i == Character::Ring2 || i == Character::Armlet2 || i == Character::Bracer2) ? 1 : 0) == subloc)
			{
				this->paperdoll[i] = 0;
				this->AddItem(item, 1);
				this->CalculateStats();
				return true;
			}
		}
	}

	return false;
}